

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

GetHandle __thiscall adios2::Remote::Read(Remote *this,size_t Start,size_t Size,void *Dest)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_109;
  string local_108 [28];
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string local_c8 [39];
  undefined1 local_a1 [40];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Core",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Engine",&local_79);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"ThrowUp",(allocator *)__lhs);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"RemoteRead",(allocator *)__rhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  helper::Throw<std::invalid_argument>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (GetHandle)0x0;
}

Assistant:

Remote::GetHandle Remote::Read(size_t Start, size_t Size, void *Dest)
{
    ThrowUp("RemoteRead");
    return (Remote::GetHandle)0;
}